

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Synth.h
# Opt level: O2

void __thiscall
Blip_Synth<2,_31>::offset(Blip_Synth<2,_31> *this,blip_time_t time,int delta,Blip_Buffer *buf)

{
  offset_resampled(this,time * buf->factor_ + buf->offset_,delta,buf);
  return;
}

Assistant:

void Blip_Synth<quality,range>::offset( blip_time_t time, int delta, Blip_Buffer* buf ) const {
	offset_resampled( time * buf->factor_ + buf->offset_, delta, buf );
}